

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

errr finish_ui_knowledge_parser(parser *p)

{
  bitflag *pbVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  ui_monster_category *puVar4;
  ui_monster_category *puVar5;
  long *p_00;
  long *plVar6;
  char *pcVar7;
  errr eVar8;
  ui_monster_category *src;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  ui_monster_category *tgt;
  ulong uVar12;
  
  p_00 = (long *)parser_priv(p);
  if (p_00 != (long *)0x0) {
    uVar12 = 0xffffffffffffffff;
    plVar6 = p_00;
    lVar11 = -0x30;
    do {
      lVar10 = lVar11;
      plVar6 = (long *)*plVar6;
      lVar11 = lVar10 + 0x30;
      uVar12 = uVar12 + 1;
    } while (plVar6 != (long *)0x0);
    if (uVar12 < 0x7fffffff) {
      if (monster_group != (ui_monster_category *)0x0) {
        cleanup_ui_knowledge_parsed_data();
      }
      monster_group = (ui_monster_category *)mem_alloc(lVar10 + 0x60);
      n_monster_group = (int)uVar12 + L'\x01';
      pbVar1 = monster_group[1].inc_flags + lVar10 + -0x18;
      pbVar1[0] = '\0';
      pbVar1[1] = '\0';
      pbVar1[2] = '\0';
      pbVar1[3] = '\0';
      pbVar1[4] = '\0';
      pbVar1[5] = '\0';
      pbVar1[6] = '\0';
      pbVar1[7] = '\0';
      pcVar7 = string_make("***Unclassified***");
      puVar5 = monster_group;
      puVar4 = monster_group + 1;
      *(char **)(monster_group[1].inc_flags + lVar10 + -0x10) = pcVar7;
      pbVar1 = puVar5[1].inc_flags + lVar10 + -8;
      pbVar1[0] = '\0';
      pbVar1[1] = '\0';
      pbVar1[2] = '\0';
      pbVar1[3] = '\0';
      pbVar1[4] = '\0';
      pbVar1[5] = '\0';
      pbVar1[6] = '\0';
      pbVar1[7] = '\0';
      flag_wipe(puVar4->inc_flags + lVar10,0xc);
      pbVar1 = monster_group[1].inc_flags + lVar10 + 0xc;
      pbVar1[0] = '\0';
      pbVar1[1] = '\0';
      pbVar1[2] = '\0';
      pbVar1[3] = '\0';
      pbVar1[4] = '\0';
      pbVar1[5] = '\0';
      pbVar1[6] = '\0';
      pbVar1[7] = '\0';
      puVar9 = (undefined8 *)*p_00;
      while (puVar4 = monster_group, puVar9 != (undefined8 *)0x0) {
        puVar2 = (undefined8 *)*puVar9;
        pbVar1 = monster_group->inc_flags;
        *(bitflag **)(monster_group[-1].inc_flags + lVar11 + -0x18) =
             monster_group->inc_flags + lVar11 + -0x18;
        uVar3 = puVar9[2];
        *(undefined8 *)(puVar4->inc_flags + lVar11 + -0x40) = puVar9[1];
        *(undefined8 *)(puVar4->inc_flags + lVar11 + -0x38) = uVar3;
        flag_copy(pbVar1 + lVar11 + -0x30,(bitflag *)(puVar9 + 3),0xc);
        *(undefined8 *)(monster_group->inc_flags + lVar11 + -0x24) =
             *(undefined8 *)((long)puVar9 + 0x24);
        mem_free(puVar9);
        lVar11 = lVar11 + -0x30;
        puVar9 = puVar2;
      }
      eVar8 = 0;
    }
    else {
      eVar8 = 0x3b;
      puVar9 = (undefined8 *)*p_00;
      while (puVar9 != (undefined8 *)0x0) {
        puVar2 = (undefined8 *)*puVar9;
        string_free((char *)puVar9[1]);
        mem_free((void *)puVar9[2]);
        mem_free(puVar9);
        puVar9 = puVar2;
      }
    }
    mem_free(p_00);
    parser_destroy(p);
    return eVar8;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                ,0xcfe,"errr finish_ui_knowledge_parser(struct parser *)");
}

Assistant:

static errr finish_ui_knowledge_parser(struct parser *p)
{
	struct ui_knowledge_parse_state *s =
		(struct ui_knowledge_parse_state*) parser_priv(p);
	struct ui_monster_category *cursor;
	size_t count;

	assert(s);

	/* Count the number of categories and allocate a flat array for them. */
	count = 0;
	for (cursor = s->categories; cursor; cursor = cursor->next) {
		++count;
	}
	if (count > INT_MAX - 1) {
		/*
		 * The sorting and display logic for monster groups assumes
		 * the number of categories fits in an int.
		 */
		cursor = s->categories;
		while (cursor) {
			struct ui_monster_category *tgt = cursor;

			cursor = cursor->next;
			string_free((char*) tgt->name);
			mem_free(tgt->inc_bases);
			mem_free(tgt);
		}
		mem_free(s);
		parser_destroy(p);
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	}
	if (monster_group) {
		cleanup_ui_knowledge_parsed_data();
	}
	monster_group = mem_alloc((count + 1) * sizeof(*monster_group));
	n_monster_group = (int) (count + 1);

	/* Set the element at the end which receives special treatment. */
	monster_group[count].next = NULL;
	monster_group[count].name = string_make("***Unclassified***");
	monster_group[count].inc_bases = NULL;
	rf_wipe(monster_group[count].inc_flags);
	monster_group[count].n_inc_bases = 0;
	monster_group[count].max_inc_bases = 0;

	/*
	 * Set the others, restoring the order they had in the data file.
	 * Release the memory for the linked list (but not pointed to data
	 * as ownership for that is transferred to the flat array).
	 */
	cursor = s->categories;
	while (cursor) {
		struct ui_monster_category *src = cursor;

		cursor = cursor->next;
		--count;
		monster_group[count].next = monster_group + count + 1;
		monster_group[count].name = src->name;
		monster_group[count].inc_bases = src->inc_bases;
		rf_copy(monster_group[count].inc_flags, src->inc_flags);
		monster_group[count].n_inc_bases = src->n_inc_bases;
		monster_group[count].max_inc_bases = src->max_inc_bases;
		mem_free(src);
	}

	mem_free(s);
	parser_destroy(p);
	return 0;
}